

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall PlanTestDoubleDependent::Run(PlanTestDoubleDependent *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  Edge *pEVar6;
  Edge *edge;
  string local_110;
  undefined1 local_f0 [8];
  string err;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  PlanTestDoubleDependent *pPStack_10;
  int fail_count;
  PlanTestDoubleDependent *this_local;
  
  pPStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_PlanTest).super_StateTestWithBuiltinRules.state_,
              "build out: cat a1 a2\nbuild a1: cat mid\nbuild a2: cat mid\nbuild mid: cat in\n",
              local_1c);
  iVar2 = local_14;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"mid",&local_41);
    pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_40);
    Node::MarkDirty(pNVar5);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"a1",&local_79);
    pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_78);
    Node::MarkDirty(pNVar5);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"a2",&local_a1);
    pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_a0);
    Node::MarkDirty(pNVar5);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"out",(allocator<char> *)(err.field_2._M_local_buf + 0xf));
    pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_c8);
    Node::MarkDirty(pNVar5);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)local_f0);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"out",(allocator<char> *)((long)&edge + 7));
    pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_110);
    bVar3 = Plan::AddTarget(&(this->super_PlanTest).plan_,pNVar5,(string *)local_f0);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0xab,"plan_.AddTarget(GetNode(\"out\"), &err)");
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)((long)&edge + 7));
    pTVar1 = g_current_test;
    bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_f0);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                       ,0xac,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar3) {
      bVar3 = Plan::more_to_do(&(this->super_PlanTest).plan_);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                         ,0xad,"plan_.more_to_do()");
      if (bVar3) {
        pEVar6 = Plan::FindWork(&(this->super_PlanTest).plan_);
        bVar3 = testing::Test::Check
                          (g_current_test,pEVar6 != (Edge *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0xb1,"edge");
        if (bVar3) {
          Plan::EdgeFinished(&(this->super_PlanTest).plan_,pEVar6,kEdgeSucceeded,(string *)local_f0)
          ;
          pTVar1 = g_current_test;
          bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_f0);
          bVar3 = testing::Test::Check
                            (pTVar1,bVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                             ,0xb3,"\"\" == err");
          if (bVar3) {
            pEVar6 = Plan::FindWork(&(this->super_PlanTest).plan_);
            bVar3 = testing::Test::Check
                              (g_current_test,pEVar6 != (Edge *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                               ,0xb6,"edge");
            if (bVar3) {
              Plan::EdgeFinished(&(this->super_PlanTest).plan_,pEVar6,kEdgeSucceeded,
                                 (string *)local_f0);
              pTVar1 = g_current_test;
              bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_f0);
              bVar3 = testing::Test::Check
                                (pTVar1,bVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                 ,0xb8,"\"\" == err");
              if (bVar3) {
                pEVar6 = Plan::FindWork(&(this->super_PlanTest).plan_);
                bVar3 = testing::Test::Check
                                  (g_current_test,pEVar6 != (Edge *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                   ,0xbb,"edge");
                if (bVar3) {
                  Plan::EdgeFinished(&(this->super_PlanTest).plan_,pEVar6,kEdgeSucceeded,
                                     (string *)local_f0);
                  pTVar1 = g_current_test;
                  bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_f0);
                  bVar3 = testing::Test::Check
                                    (pTVar1,bVar3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                     ,0xbd,"\"\" == err");
                  if (bVar3) {
                    pEVar6 = Plan::FindWork(&(this->super_PlanTest).plan_);
                    bVar3 = testing::Test::Check
                                      (g_current_test,pEVar6 != (Edge *)0x0,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                       ,0xc0,"edge");
                    if (bVar3) {
                      Plan::EdgeFinished(&(this->super_PlanTest).plan_,pEVar6,kEdgeSucceeded,
                                         (string *)local_f0);
                      pTVar1 = g_current_test;
                      bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f0);
                      bVar3 = testing::Test::Check
                                        (pTVar1,bVar3,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                         ,0xc2,"\"\" == err");
                      if (bVar3) {
                        pEVar6 = Plan::FindWork(&(this->super_PlanTest).plan_);
                        bVar3 = testing::Test::Check
                                          (g_current_test,pEVar6 == (Edge *)0x0,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                           ,0xc5,"edge");
                        if (bVar3) {
                          edge._0_4_ = 0;
                        }
                        else {
                          testing::Test::AddAssertionFailure(g_current_test);
                          edge._0_4_ = 1;
                        }
                      }
                      else {
                        testing::Test::AddAssertionFailure(g_current_test);
                        edge._0_4_ = 1;
                      }
                    }
                    else {
                      testing::Test::AddAssertionFailure(g_current_test);
                      edge._0_4_ = 1;
                    }
                  }
                  else {
                    testing::Test::AddAssertionFailure(g_current_test);
                    edge._0_4_ = 1;
                  }
                }
                else {
                  testing::Test::AddAssertionFailure(g_current_test);
                  edge._0_4_ = 1;
                }
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                edge._0_4_ = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              edge._0_4_ = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            edge._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          edge._0_4_ = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        edge._0_4_ = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      edge._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_f0);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(PlanTest, DoubleDependent) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat a1 a2\n"
"build a1: cat mid\n"
"build a2: cat mid\n"
"build mid: cat in\n"));
  GetNode("mid")->MarkDirty();
  GetNode("a1")->MarkDirty();
  GetNode("a2")->MarkDirty();
  GetNode("out")->MarkDirty();

  string err;
  EXPECT_TRUE(plan_.AddTarget(GetNode("out"), &err));
  ASSERT_EQ("", err);
  ASSERT_TRUE(plan_.more_to_do());

  Edge* edge;
  edge = plan_.FindWork();
  ASSERT_TRUE(edge);  // cat in
  plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  edge = plan_.FindWork();
  ASSERT_TRUE(edge);  // cat mid
  plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  edge = plan_.FindWork();
  ASSERT_TRUE(edge);  // cat mid
  plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  edge = plan_.FindWork();
  ASSERT_TRUE(edge);  // cat a1 a2
  plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  edge = plan_.FindWork();
  ASSERT_FALSE(edge);  // done
}